

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O2

int YP_md_set_parameter_array(YPSpur *spur,int param_id,double *value)

{
  int iVar1;
  YPSpur_msg local_40;
  
  local_40.msg_type = 1;
  local_40.pid = (long)spur->pid;
  local_40.type = 0x100;
  local_40.data[0]._0_4_ = *(undefined4 *)value;
  local_40.data[0]._4_4_ = *(undefined4 *)((long)value + 4);
  local_40.data[1]._0_4_ = *(undefined4 *)(value + 1);
  local_40.data[1]._4_4_ = *(undefined4 *)((long)value + 0xc);
  local_40.cs = param_id;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_40);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int YP_md_set_parameter_array(YPSpur* spur, int param_id, double* value)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_PARAM_SET;
  msg.cs = param_id;
  msg.data[0] = value[0];
  msg.data[1] = value[1];

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}